

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O1

void bmpmask16toimage(OPJ_UINT8 *pData,OPJ_UINT32 stride,opj_image_t *image,OPJ_UINT32 redMask,
                     OPJ_UINT32 greenMask,OPJ_UINT32 blueMask,OPJ_UINT32 alphaMask)

{
  long lVar1;
  uint uVar2;
  opj_image_comp_t *poVar3;
  OPJ_INT32 *pOVar4;
  OPJ_INT32 *pOVar5;
  OPJ_INT32 *pOVar6;
  OPJ_UINT32 OVar7;
  OPJ_UINT32 OVar8;
  OPJ_UINT32 OVar9;
  uint uVar10;
  int iVar11;
  byte bVar12;
  byte bVar13;
  OPJ_UINT8 *pOVar14;
  byte bVar15;
  OPJ_UINT32 OVar16;
  OPJ_UINT32 OVar17;
  ulong uVar18;
  byte bVar19;
  uint uVar20;
  OPJ_UINT32 OVar21;
  
  bVar15 = 0;
  bVar13 = 0;
  OVar17 = 0;
  if (redMask != 0) {
    OVar17 = 0;
    OVar7 = redMask;
    bVar13 = 0;
    if ((redMask & 1) == 0) {
      bVar13 = 0;
      OVar21 = redMask;
      do {
        OVar7 = OVar21 >> 1;
        bVar13 = bVar13 + 1;
        uVar2 = OVar21 & 2;
        OVar21 = OVar7;
      } while (uVar2 == 0);
    }
    if ((OVar7 & 1) != 0) {
      OVar17 = 0;
      uVar18 = (ulong)OVar7;
      do {
        uVar18 = uVar18 >> 1;
        OVar17 = OVar17 + 1;
        uVar2 = OVar7 & 2;
        OVar7 = (OPJ_UINT32)uVar18;
      } while (uVar2 != 0);
    }
  }
  OVar7 = 0;
  if (greenMask != 0) {
    OVar7 = 0;
    bVar15 = 0;
    uVar2 = greenMask & 1;
    uVar10 = greenMask;
    while (uVar2 == 0) {
      bVar15 = bVar15 + 1;
      uVar2 = uVar10 & 2;
      uVar10 = uVar10 >> 1;
    }
    if ((uVar10 & 1) != 0) {
      OVar7 = 0;
      uVar18 = (ulong)uVar10;
      do {
        uVar18 = uVar18 >> 1;
        OVar7 = OVar7 + 1;
        uVar2 = uVar10 & 2;
        uVar10 = (uint)uVar18;
      } while (uVar2 != 0);
    }
  }
  bVar12 = 0;
  bVar19 = 0;
  OVar21 = 0;
  if (blueMask != 0) {
    OVar21 = 0;
    OVar8 = blueMask;
    bVar19 = 0;
    if ((blueMask & 1) == 0) {
      bVar19 = 0;
      OVar9 = blueMask;
      do {
        OVar8 = OVar9 >> 1;
        bVar19 = bVar19 + 1;
        uVar2 = OVar9 & 2;
        OVar9 = OVar8;
      } while (uVar2 == 0);
    }
    if ((OVar8 & 1) != 0) {
      OVar21 = 0;
      uVar18 = (ulong)OVar8;
      do {
        uVar18 = uVar18 >> 1;
        OVar21 = OVar21 + 1;
        uVar2 = OVar8 & 2;
        OVar8 = (OPJ_UINT32)uVar18;
      } while (uVar2 != 0);
    }
  }
  poVar3 = image->comps;
  uVar2 = image->numcomps;
  OVar8 = 0;
  if (alphaMask != 0) {
    OVar8 = 0;
    bVar12 = 0;
    OVar9 = alphaMask;
    if ((alphaMask & 1) == 0) {
      bVar12 = 0;
      OVar16 = alphaMask;
      do {
        OVar9 = OVar16 >> 1;
        bVar12 = bVar12 + 1;
        uVar10 = OVar16 & 2;
        OVar16 = OVar9;
      } while (uVar10 == 0);
    }
    if ((OVar9 & 1) != 0) {
      OVar8 = 0;
      uVar18 = (ulong)OVar9;
      do {
        uVar18 = uVar18 >> 1;
        OVar8 = OVar8 + 1;
        uVar10 = OVar9 & 2;
        OVar9 = (OPJ_UINT32)uVar18;
      } while (uVar10 != 0);
    }
  }
  uVar10 = poVar3->w;
  OVar9 = poVar3->h;
  poVar3->prec = OVar17;
  poVar3[1].prec = OVar7;
  poVar3[2].prec = OVar21;
  if (3 < uVar2) {
    poVar3[3].prec = OVar8;
  }
  if (OVar9 != 0) {
    pOVar14 = pData + (OVar9 - 1) * stride;
    iVar11 = 0;
    OVar17 = 0;
    do {
      if ((ulong)uVar10 != 0) {
        lVar1 = (long)iVar11 * 4;
        pOVar4 = poVar3->data;
        pOVar5 = poVar3[1].data;
        pOVar6 = poVar3[2].data;
        iVar11 = iVar11 + uVar10;
        uVar18 = 0;
        do {
          uVar20 = (uint)CONCAT11(pOVar14[(int)uVar18 + 1],pOVar14[uVar18 & 0xffffffff]);
          *(uint *)((long)pOVar4 + uVar18 * 2 + lVar1) = (uVar20 & redMask) >> (bVar13 & 0x1f);
          *(uint *)((long)pOVar5 + uVar18 * 2 + lVar1) = (uVar20 & greenMask) >> (bVar15 & 0x1f);
          *(uint *)((long)pOVar6 + uVar18 * 2 + lVar1) = (uVar20 & blueMask) >> (bVar19 & 0x1f);
          if (3 < uVar2) {
            *(uint *)((long)poVar3[3].data + uVar18 * 2 + lVar1) =
                 (uVar20 & alphaMask) >> (bVar12 & 0x1f);
          }
          uVar18 = uVar18 + 2;
        } while ((ulong)uVar10 * 2 != uVar18);
      }
      pOVar14 = pOVar14 + -(ulong)stride;
      OVar17 = OVar17 + 1;
    } while (OVar17 != OVar9);
  }
  return;
}

Assistant:

static void bmpmask16toimage(const OPJ_UINT8* pData, OPJ_UINT32 stride,
                             opj_image_t* image, OPJ_UINT32 redMask, OPJ_UINT32 greenMask,
                             OPJ_UINT32 blueMask, OPJ_UINT32 alphaMask)
{
    int index;
    OPJ_UINT32 width, height;
    OPJ_UINT32 x, y;
    const OPJ_UINT8 *pSrc = NULL;
    OPJ_BOOL hasAlpha;
    OPJ_UINT32 redShift,   redPrec;
    OPJ_UINT32 greenShift, greenPrec;
    OPJ_UINT32 blueShift,  bluePrec;
    OPJ_UINT32 alphaShift, alphaPrec;

    width  = image->comps[0].w;
    height = image->comps[0].h;

    hasAlpha = image->numcomps > 3U;

    bmp_mask_get_shift_and_prec(redMask,   &redShift,   &redPrec);
    bmp_mask_get_shift_and_prec(greenMask, &greenShift, &greenPrec);
    bmp_mask_get_shift_and_prec(blueMask,  &blueShift,  &bluePrec);
    bmp_mask_get_shift_and_prec(alphaMask, &alphaShift, &alphaPrec);

    image->comps[0].prec = redPrec;
    image->comps[1].prec = greenPrec;
    image->comps[2].prec = bluePrec;
    if (hasAlpha) {
        image->comps[3].prec = alphaPrec;
    }

    index = 0;
    pSrc = pData + (height - 1U) * stride;
    for (y = 0; y < height; y++) {
        for (x = 0; x < width; x++) {
            OPJ_UINT32 value = 0U;

            value |= ((OPJ_UINT32)pSrc[2 * x + 0]) <<  0;
            value |= ((OPJ_UINT32)pSrc[2 * x + 1]) <<  8;

            image->comps[0].data[index] = (OPJ_INT32)((value & redMask)   >>
                                          redShift);   /* R */
            image->comps[1].data[index] = (OPJ_INT32)((value & greenMask) >>
                                          greenShift); /* G */
            image->comps[2].data[index] = (OPJ_INT32)((value & blueMask)  >>
                                          blueShift);  /* B */
            if (hasAlpha) {
                image->comps[3].data[index] = (OPJ_INT32)((value & alphaMask)  >>
                                              alphaShift);  /* A */
            }
            index++;
        }
        pSrc -= stride;
    }
}